

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

void __thiscall AmpIO::SetReadData(AmpIO *this,quadlet_t *buf)

{
  uint uVar1;
  __uint32_t _Var2;
  uint32_t uVar3;
  double extraout_XMM0_Qa;
  uint local_20;
  uint i;
  uint numQuads;
  quadlet_t *buf_local;
  AmpIO *this_local;
  
  uVar1 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])();
  for (local_20 = 0; local_20 < uVar1 >> 2; local_20 = local_20 + 1) {
    _Var2 = __bswap_32(buf[local_20]);
    this->ReadBuffer[local_20] = _Var2;
  }
  for (local_20 = 0; local_20 < this->NumEncoders; local_20 = local_20 + 1) {
    SetEncoderVelocityData(this,local_20);
  }
  uVar3 = GetTimestamp(this);
  (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[10])();
  (this->super_FpgaIO).firmwareTime =
       (double)(uVar3 + 1) * extraout_XMM0_Qa + (this->super_FpgaIO).firmwareTime;
  return;
}

Assistant:

void AmpIO::SetReadData(const quadlet_t *buf)
{
    unsigned int numQuads = GetReadNumBytes() / sizeof(quadlet_t);
    unsigned int i;
    for (i = 0; i < numQuads; i++) {
        ReadBuffer[i] = bswap_32(buf[i]);
    }
    for (i = 0; i < NumEncoders; i++) {
        SetEncoderVelocityData(i);
    }
    // Add 1 to timestamp because block read clears counter, rather than incrementing
    firmwareTime += (GetTimestamp()+1)*GetFPGAClockPeriod();
}